

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

QString * __thiscall
QTextBrowser::historyTitle(QString *__return_storage_ptr__,QTextBrowser *this,int i)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  HistoryEntry local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QTextBrowserPrivate::history
            (&local_50,
             *(QTextBrowserPrivate **)
              &(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.
               field_0x8,i);
  qVar3 = local_50.title.d.size;
  pcVar2 = local_50.title.d.ptr;
  pDVar1 = local_50.title.d.d;
  local_50.title.d.d = (Data *)0x0;
  local_50.title.d.ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = pcVar2;
  local_50.title.d.size = 0;
  (__return_storage_ptr__->d).size = qVar3;
  QTextBrowserPrivate::HistoryEntry::~HistoryEntry(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QTextBrowser::historyTitle(int i) const
{
    Q_D(const QTextBrowser);
    return d->history(i).title;
}